

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbezier.cpp
# Opt level: O0

void __thiscall
QBezier::addToPolygon(QBezier *this,QPolygonF *polygon,qreal bezier_flattening_threshold)

{
  int iVar1;
  double *pdVar2;
  long lVar3;
  rvalue_ref in_RSI;
  void *in_RDI;
  long in_FS_OFFSET;
  double in_XMM0_Qa;
  double dVar4;
  qreal d;
  qreal l;
  QBezier *b;
  int top;
  qreal x4x1;
  qreal y4y1;
  int levels [10];
  QBezier beziers [10];
  rvalue_ref t;
  QBezier *in_stack_fffffffffffffc00;
  pair<QBezier,_QBezier> *in_stack_fffffffffffffc08;
  tuple<QBezier_&,_QBezier_&> *in_stack_fffffffffffffc10;
  double local_3d0;
  double local_3c8;
  int local_3b4;
  QBezier *in_stack_fffffffffffffc88;
  QPointF local_308;
  double local_2f8;
  double local_2f0;
  double local_2e8;
  double local_2e0;
  double local_2d8;
  double local_2d0;
  double local_2c8;
  double local_2c0;
  int local_2b8 [12];
  double local_288 [80];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  memset(local_288,0xff,0x280);
  memset(local_2b8,0xaa,0x28);
  memcpy(local_288,in_RDI,0x40);
  local_2b8[0] = 9;
  local_3b4 = 0;
  while (-1 < local_3b4) {
    lVar3 = (long)local_3b4;
    pdVar2 = local_288 + lVar3 * 8;
    local_2c0 = local_288[lVar3 * 8 + 7] - local_288[lVar3 * 8 + 1];
    local_2c8 = local_288[lVar3 * 8 + 6] - *pdVar2;
    local_3c8 = qAbs<double>(&local_2c8);
    dVar4 = qAbs<double>(&local_2c0);
    local_3c8 = local_3c8 + dVar4;
    if (local_3c8 <= 1.0) {
      local_2e0 = *pdVar2 - local_288[lVar3 * 8 + 2];
      in_stack_fffffffffffffc00 = (QBezier *)qAbs<double>(&local_2e0);
      local_2e8 = local_288[lVar3 * 8 + 1] - local_288[lVar3 * 8 + 3];
      dVar4 = qAbs<double>(&local_2e8);
      in_stack_fffffffffffffc08 =
           (pair<QBezier,_QBezier> *)((double)in_stack_fffffffffffffc00 + dVar4);
      local_2f0 = *pdVar2 - local_288[lVar3 * 8 + 4];
      dVar4 = qAbs<double>(&local_2f0);
      in_stack_fffffffffffffc10 =
           (tuple<QBezier_&,_QBezier_&> *)((double)in_stack_fffffffffffffc08 + dVar4);
      local_2f8 = local_288[lVar3 * 8 + 1] - local_288[lVar3 * 8 + 5];
      local_3d0 = qAbs<double>(&local_2f8);
      local_3d0 = (double)in_stack_fffffffffffffc10 + local_3d0;
      local_3c8 = 1.0;
    }
    else {
      local_2d0 = local_2c8 * (local_288[lVar3 * 8 + 1] - local_288[lVar3 * 8 + 3]) +
                  -(local_2c0 * (*pdVar2 - local_288[lVar3 * 8 + 2]));
      local_3d0 = qAbs<double>(&local_2d0);
      local_2d8 = local_2c8 * (local_288[lVar3 * 8 + 1] - local_288[lVar3 * 8 + 5]) +
                  -(local_2c0 * (*pdVar2 - local_288[lVar3 * 8 + 4]));
      dVar4 = qAbs<double>(&local_2d8);
      local_3d0 = local_3d0 + dVar4;
    }
    if ((local_3d0 < in_XMM0_Qa * local_3c8) || (local_2b8[local_3b4] == 0)) {
      t = in_RSI;
      QPointF::QPointF(&local_308,local_288[lVar3 * 8 + 6],local_288[lVar3 * 8 + 7]);
      QList<QPointF>::append((QList<QPointF> *)in_stack_fffffffffffffc00,t);
      local_3b4 = local_3b4 + -1;
    }
    else {
      split(in_stack_fffffffffffffc88);
      std::tie<QBezier,QBezier>(&in_stack_fffffffffffffc08->first,in_stack_fffffffffffffc00);
      std::tuple<QBezier&,QBezier&>::operator=(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
      iVar1 = local_2b8[local_3b4];
      local_2b8[local_3b4] = iVar1 + -1;
      local_2b8[local_3b4 + 1] = iVar1 + -1;
      local_3b4 = local_3b4 + 1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QBezier::addToPolygon(QPolygonF *polygon, qreal bezier_flattening_threshold) const
{
    QBezier beziers[10];
    int levels[10];
    beziers[0] = *this;
    levels[0] = 9;
    int top = 0;

    while (top >= 0) {
        QBezier *b = &beziers[top];
        // check if we can pop the top bezier curve from the stack
        qreal y4y1 = b->y4 - b->y1;
        qreal x4x1 = b->x4 - b->x1;
        qreal l = qAbs(x4x1) + qAbs(y4y1);
        qreal d;
        if (l > 1.) {
            d = qAbs( (x4x1)*(b->y1 - b->y2) - (y4y1)*(b->x1 - b->x2) )
                + qAbs( (x4x1)*(b->y1 - b->y3) - (y4y1)*(b->x1 - b->x3) );
        } else {
            d = qAbs(b->x1 - b->x2) + qAbs(b->y1 - b->y2) +
                qAbs(b->x1 - b->x3) + qAbs(b->y1 - b->y3);
            l = 1.;
        }
        if (d < bezier_flattening_threshold * l || levels[top] == 0) {
            // good enough, we pop it off and add the endpoint
            polygon->append(QPointF(b->x4, b->y4));
            --top;
        } else {
            // split, second half of the polygon goes lower into the stack
            std::tie(b[1], b[0]) = b->split();
            levels[top + 1] = --levels[top];
            ++top;
        }
    }
}